

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorPicker::mousePressEvent(QColorPicker *this,QMouseEvent *m)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QRect QVar5;
  undefined1 auVar6 [16];
  QPoint local_48;
  int local_40;
  int local_3c;
  void *local_38;
  int *local_30;
  int *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  auVar6 = QEventPoint::position();
  dVar4 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
  bVar1 = 2147483647.0 < dVar4;
  if (dVar4 <= -2147483648.0) {
    dVar4 = -2147483648.0;
  }
  dVar3 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
  bVar2 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  QVar5 = QWidget::contentsRect((QWidget *)this);
  local_48.xp.m_i =
       (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4) -
       QVar5.x1.m_i;
  local_48.yp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3) -
       QVar5.y1.m_i;
  setCol(this,&local_48);
  local_3c = this->hue;
  local_40 = this->sat;
  local_30 = &local_3c;
  local_28 = &local_40;
  local_38 = (void *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mousePressEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    setCol(p);
    emit newCol(hue, sat);
}